

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

float Abc_SclComputeAreaClass(SC_Cell *pRepr)

{
  int iVar1;
  int iVar2;
  SC_Cell *pSVar3;
  SC_Cell *pCell;
  float fVar4;
  
  fVar4 = 0.0;
  iVar1 = 0;
  pSVar3 = pRepr;
  do {
    if (pSVar3->fSkip == 0) {
      fVar4 = fVar4 + pSVar3->area;
      iVar1 = iVar1 + 1;
    }
    pSVar3 = pSVar3->pNext;
  } while (pSVar3 != pRepr);
  iVar2 = 1;
  if (1 < iVar1) {
    iVar2 = iVar1;
  }
  return fVar4 / (float)iVar2;
}

Assistant:

float Abc_SclComputeAreaClass( SC_Cell * pRepr )
{
    SC_Cell * pCell;
    float Area = 0;
    int i, Count = 0;
    SC_RingForEachCell( pRepr, pCell, i )
    {
        if ( pCell->fSkip ) 
            continue;
        Area += pCell->area;
        Count++;
    }
    return Area / Abc_MaxInt(1, Count);
}